

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O2

bool __thiscall chatter::Protocol::handle_pong(Protocol *this,ptr *packet)

{
  PeerState PVar1;
  Packet *this_00;
  Peer *peer;
  long in_RAX;
  uint64_t uVar2;
  size_t in_RCX;
  void *in_RDX;
  uint64_t ts;
  long local_28;
  
  this_00 = (packet->super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peer = this_00->m_peer;
  PVar1 = peer->m_state;
  if (PVar1 == CONNECTED) {
    local_28 = in_RAX;
    Packet::read(this_00,(int)&local_28,in_RDX,in_RCX);
    uVar2 = Host::timestamp_now(this->m_host);
    calculate_rtt(this,peer,uVar2 - local_28);
  }
  return PVar1 == CONNECTED;
}

Assistant:

bool Protocol::handle_pong(const Packet::ptr packet)
{
    Peer* peer = packet->m_peer;
    if (peer->m_state != PeerState::CONNECTED)
        /* TODO(ben): Peer not connected error */
        return false;

    uint64_t ts;
    packet->read(ts);

    calculate_rtt(peer, m_host->timestamp_now() - ts);

    return true;
}